

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_compat.cc
# Opt level: O0

int CBB_finish_i2d(CBB *cbb,uint8_t **outp)

{
  int iVar1;
  ulong local_30;
  size_t der_len;
  uint8_t *der;
  uint8_t **outp_local;
  CBB *cbb_local;
  
  der = (uint8_t *)outp;
  outp_local = (uint8_t **)cbb;
  if (cbb->is_child != '\0') {
    __assert_fail("!cbb->is_child",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/asn1_compat.cc"
                  ,0x1d,"int CBB_finish_i2d(CBB *, uint8_t **)");
  }
  if ((*(byte *)((long)&cbb->u + 0x18) & 1) == 0) {
    __assert_fail("cbb->u.base.can_resize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/asn1_compat.cc"
                  ,0x1e,"int CBB_finish_i2d(CBB *, uint8_t **)");
  }
  iVar1 = CBB_finish(cbb,(uint8_t **)&der_len,&local_30);
  if (iVar1 == 0) {
    CBB_cleanup((CBB *)outp_local);
    cbb_local._4_4_ = -1;
  }
  else if (local_30 < 0x80000000) {
    if (der != (uint8_t *)0x0) {
      if (*(long *)der == 0) {
        *(size_t *)der = der_len;
        der_len = 0;
      }
      else {
        OPENSSL_memcpy(*(void **)der,(void *)der_len,local_30);
        *(ulong *)der = local_30 + *(long *)der;
      }
    }
    OPENSSL_free((void *)der_len);
    cbb_local._4_4_ = (int)local_30;
  }
  else {
    OPENSSL_free((void *)der_len);
    cbb_local._4_4_ = -1;
  }
  return cbb_local._4_4_;
}

Assistant:

int CBB_finish_i2d(CBB *cbb, uint8_t **outp) {
  assert(!cbb->is_child);
  assert(cbb->u.base.can_resize);

  uint8_t *der;
  size_t der_len;
  if (!CBB_finish(cbb, &der, &der_len)) {
    CBB_cleanup(cbb);
    return -1;
  }
  if (der_len > INT_MAX) {
    OPENSSL_free(der);
    return -1;
  }
  if (outp != NULL) {
    if (*outp == NULL) {
      *outp = der;
      der = NULL;
    } else {
      OPENSSL_memcpy(*outp, der, der_len);
      *outp += der_len;
    }
  }
  OPENSSL_free(der);
  return (int)der_len;
}